

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaResub.c
# Opt level: O2

Gia_ResbMan_t * Gia_ResbAlloc(int nWords)

{
  Gia_ResbMan_t *pGVar1;
  Vec_Int_t *pVVar2;
  Vec_Wec_t *pVVar3;
  Vec_Ptr_t *pVVar4;
  word *pwVar5;
  Vec_Wrd_t *pVVar6;
  size_t __nmemb;
  
  pGVar1 = (Gia_ResbMan_t *)calloc(1,0xb8);
  pGVar1->nWords = nWords;
  pVVar2 = Vec_IntAlloc(100);
  pGVar1->vUnateLits[0] = pVVar2;
  pVVar2 = Vec_IntAlloc(100);
  pGVar1->vUnateLits[1] = pVVar2;
  pVVar2 = Vec_IntAlloc(100);
  pGVar1->vNotUnateVars[0] = pVVar2;
  pVVar2 = Vec_IntAlloc(100);
  pGVar1->vNotUnateVars[1] = pVVar2;
  pVVar2 = Vec_IntAlloc(100);
  pGVar1->vUnatePairs[0] = pVVar2;
  pVVar2 = Vec_IntAlloc(100);
  pGVar1->vUnatePairs[1] = pVVar2;
  pVVar2 = Vec_IntAlloc(100);
  pGVar1->vUnateLitsW[0] = pVVar2;
  pVVar2 = Vec_IntAlloc(100);
  pGVar1->vUnateLitsW[1] = pVVar2;
  pVVar2 = Vec_IntAlloc(100);
  pGVar1->vUnatePairsW[0] = pVVar2;
  pVVar2 = Vec_IntAlloc(100);
  pGVar1->vUnatePairsW[1] = pVVar2;
  pVVar3 = Vec_WecAlloc(nWords << 6);
  pGVar1->vSorter = pVVar3;
  pVVar2 = Vec_IntAlloc(100);
  pGVar1->vBinateVars = pVVar2;
  pVVar2 = Vec_IntAlloc(100);
  pGVar1->vGates = pVVar2;
  pVVar4 = Vec_PtrAlloc(100);
  pGVar1->vDivs = pVVar4;
  __nmemb = (size_t)nWords;
  pwVar5 = (word *)calloc(__nmemb,8);
  pGVar1->pSets[0] = pwVar5;
  pwVar5 = (word *)calloc(__nmemb,8);
  pGVar1->pSets[1] = pwVar5;
  pwVar5 = (word *)calloc(__nmemb,8);
  pGVar1->pDivA = pwVar5;
  pwVar5 = (word *)calloc(__nmemb,8);
  pGVar1->pDivB = pwVar5;
  pVVar6 = Vec_WrdAlloc(100);
  pGVar1->vSims = pVVar6;
  return pGVar1;
}

Assistant:

Gia_ResbMan_t * Gia_ResbAlloc( int nWords )
{
    Gia_ResbMan_t * p   = ABC_CALLOC( Gia_ResbMan_t, 1 );
    p->nWords           = nWords;
    p->vUnateLits[0]    = Vec_IntAlloc( 100 );
    p->vUnateLits[1]    = Vec_IntAlloc( 100 );
    p->vNotUnateVars[0] = Vec_IntAlloc( 100 );
    p->vNotUnateVars[1] = Vec_IntAlloc( 100 );
    p->vUnatePairs[0]   = Vec_IntAlloc( 100 );
    p->vUnatePairs[1]   = Vec_IntAlloc( 100 );
    p->vUnateLitsW[0]   = Vec_IntAlloc( 100 );
    p->vUnateLitsW[1]   = Vec_IntAlloc( 100 );
    p->vUnatePairsW[0]  = Vec_IntAlloc( 100 );
    p->vUnatePairsW[1]  = Vec_IntAlloc( 100 );
    p->vSorter          = Vec_WecAlloc( nWords*64 );
    p->vBinateVars      = Vec_IntAlloc( 100 );
    p->vGates           = Vec_IntAlloc( 100 );
    p->vDivs            = Vec_PtrAlloc( 100 );
    p->pSets[0]         = ABC_CALLOC( word, nWords );
    p->pSets[1]         = ABC_CALLOC( word, nWords );
    p->pDivA            = ABC_CALLOC( word, nWords );
    p->pDivB            = ABC_CALLOC( word, nWords );
    p->vSims            = Vec_WrdAlloc( 100 );
    return p;
}